

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEnc_Encode2(CLzmaEnc *p,ICompressProgressPtr progress)

{
  SRes SVar1;
  SRes local_1c;
  SRes res;
  ICompressProgressPtr progress_local;
  CLzmaEnc *p_local;
  
  do {
    local_1c = LzmaEnc_CodeOneBlock(p,0,0);
    if ((local_1c != 0) || (p->finished != 0)) goto LAB_001d3b36;
  } while ((progress == (ICompressProgressPtr)0x0) ||
          (SVar1 = (*progress->Progress)
                             (progress,p->nowPos64,
                              (UInt64)((p->rc).buf +
                                      (p->rc).cacheSize +
                                      ((p->rc).processed - (long)(p->rc).bufBase))), SVar1 == 0));
  local_1c = 10;
LAB_001d3b36:
  LzmaEnc_Finish(p);
  return local_1c;
}

Assistant:

Z7_NO_INLINE
static SRes LzmaEnc_Encode2(CLzmaEnc *p, ICompressProgressPtr progress)
{
  SRes res = SZ_OK;

  #ifndef Z7_ST
  Byte allocaDummy[0x300];
  allocaDummy[0] = 0;
  allocaDummy[1] = allocaDummy[0];
  #endif

  for (;;)
  {
    res = LzmaEnc_CodeOneBlock(p, 0, 0);
    if (res != SZ_OK || p->finished)
      break;
    if (progress)
    {
      res = ICompressProgress_Progress(progress, p->nowPos64, RangeEnc_GetProcessed(&p->rc));
      if (res != SZ_OK)
      {
        res = SZ_ERROR_PROGRESS;
        break;
      }
    }
  }
  
  LzmaEnc_Finish((CLzmaEncHandle)(void *)p);

  /*
  if (res == SZ_OK && !Inline_MatchFinder_IsFinishedOK(&MFB))
    res = SZ_ERROR_FAIL;
  }
  */

  return res;
}